

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

int __thiscall re2::Prog::ComputeFirstByte(Prog *this)

{
  iterator piVar1;
  InstOp IVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  iterator piVar6;
  ostream *poVar7;
  Prog *in_RDI;
  Inst *ip;
  int id;
  iterator it;
  SparseSet q;
  int b;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  uint in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  InstOp in_stack_fffffffffffffdc4;
  ostream *in_stack_fffffffffffffdc8;
  LogMessage *in_stack_fffffffffffffdd0;
  LogMessage local_1e8;
  Inst *local_68;
  int local_5c;
  iterator local_58;
  uint local_14;
  uint local_4;
  
  local_14 = 0xffffffff;
  size(in_RDI);
  SparseSetT<void>::SparseSetT
            ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffdac);
  start(in_RDI);
  SparseSetT<void>::insert
            ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd8c);
  local_58 = SparseSetT<void>::begin((SparseSetT<void> *)0x24c0c7);
  do {
    piVar1 = local_58;
    piVar6 = SparseSetT<void>::end
                       ((SparseSetT<void> *)
                        CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    if (piVar1 == piVar6) {
      local_4 = local_14;
LAB_0024c4a6:
      SparseSetT<void>::~SparseSetT
                ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      return local_4;
    }
    local_5c = *local_58;
    local_68 = inst((Prog *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                    in_stack_fffffffffffffd8c);
    IVar2 = Inst::opcode(local_68);
    switch(IVar2) {
    case kInstAltMatch:
      SparseSetT<void>::insert
                ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd8c);
      break;
    case kInstByteRange:
      iVar3 = Inst::last(local_68);
      if (iVar3 == 0) {
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                   ,in_stack_fffffffffffffd8c);
      }
      iVar3 = Inst::lo(local_68);
      iVar4 = Inst::hi(local_68);
      if (iVar3 != iVar4) {
        local_4 = 0xffffffff;
        goto LAB_0024c4a6;
      }
      iVar3 = Inst::foldcase(local_68);
      if (((iVar3 != 0) &&
          (in_stack_fffffffffffffda4 = Inst::lo(local_68), 0x60 < in_stack_fffffffffffffda4)) &&
         (in_stack_fffffffffffffda0 = Inst::lo(local_68), in_stack_fffffffffffffda0 < 0x7b)) {
        local_4 = 0xffffffff;
        goto LAB_0024c4a6;
      }
      if (local_14 == 0xffffffff) {
        local_14 = Inst::lo(local_68);
      }
      else {
        in_stack_fffffffffffffd94 = local_14;
        uVar5 = Inst::lo(local_68);
        if (in_stack_fffffffffffffd94 != uVar5) {
          local_4 = 0xffffffff;
          goto LAB_0024c4a6;
        }
      }
      break;
    case kInstCapture:
    case kInstEmptyWidth:
    case kInstNop:
      in_stack_fffffffffffffd90 = Inst::last(local_68);
      if (in_stack_fffffffffffffd90 == 0) {
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)((ulong)in_stack_fffffffffffffd94 << 0x20),
                   in_stack_fffffffffffffd8c);
      }
      in_stack_fffffffffffffd8c = Inst::out(local_68);
      if (in_stack_fffffffffffffd8c != 0) {
        Inst::out(local_68);
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                   ,in_stack_fffffffffffffd8c);
      }
      break;
    case kInstMatch:
      local_4 = 0xffffffff;
      goto LAB_0024c4a6;
    case kInstFail:
      break;
    default:
      LogMessage::LogMessage
                (in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc4);
      in_stack_fffffffffffffdd0 = (LogMessage *)LogMessage::stream(&local_1e8);
      in_stack_fffffffffffffdc8 = std::operator<<((ostream *)in_stack_fffffffffffffdd0,"unhandled ")
      ;
      in_stack_fffffffffffffdc4 = Inst::opcode(local_68);
      poVar7 = (ostream *)
               std::ostream::operator<<(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
      std::operator<<(poVar7," in ComputeFirstByte");
      LogMessage::~LogMessage
                ((LogMessage *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

int Prog::ComputeFirstByte() {
  int b = -1;
  SparseSet q(size());
  q.insert(start());
  for (SparseSet::iterator it = q.begin(); it != q.end(); ++it) {
    int id = *it;
    Prog::Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled " << ip->opcode() << " in ComputeFirstByte";
        break;

      case kInstMatch:
        // The empty string matches: no first byte.
        return -1;

      case kInstByteRange:
        if (!ip->last())
          q.insert(id+1);

        // Must match only a single byte
        if (ip->lo() != ip->hi())
          return -1;
        if (ip->foldcase() && 'a' <= ip->lo() && ip->lo() <= 'z')
          return -1;
        // If we haven't seen any bytes yet, record it;
        // otherwise must match the one we saw before.
        if (b == -1)
          b = ip->lo();
        else if (b != ip->lo())
          return -1;
        break;

      case kInstNop:
      case kInstCapture:
      case kInstEmptyWidth:
        if (!ip->last())
          q.insert(id+1);

        // Continue on.
        // Ignore ip->empty() flags for kInstEmptyWidth
        // in order to be as conservative as possible
        // (assume all possible empty-width flags are true).
        if (ip->out())
          q.insert(ip->out());
        break;

      case kInstAltMatch:
        DCHECK(!ip->last());
        q.insert(id+1);
        break;

      case kInstFail:
        break;
    }
  }
  return b;
}